

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_body.hpp
# Opt level: O2

void iutest::Test::RecordProperty<int>(string *key,int *value)

{
  string local_30;
  
  PrintToString<int>(&local_30,value);
  RecordPropertyString(key,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void RecordProperty(const ::std::string& key, const T& value)
    {
        RecordPropertyString(key, PrintToString(value));
    }